

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

char * cmsys::SystemTools::SplitPathRootComponent(string *p,string *root)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  long local_28;
  size_t n;
  char *c;
  string *root_local;
  string *p_local;
  
  n = std::__cxx11::string::c_str();
  if (((*(char *)n == '/') && (*(char *)(n + 1) == '/')) ||
     ((*(char *)n == '\\' && (*(char *)(n + 1) == '\\')))) {
    if (root != (string *)0x0) {
      std::__cxx11::string::operator=((string *)root,"//");
    }
    n = n + 2;
  }
  else if ((*(char *)n == '/') || (*(char *)n == '\\')) {
    if (root != (string *)0x0) {
      std::__cxx11::string::operator=((string *)root,"/");
    }
    n = n + 1;
  }
  else if (((*(char *)n == '\0') || (*(char *)(n + 1) != ':')) ||
          ((*(char *)(n + 2) != '/' && (*(char *)(n + 2) != '\\')))) {
    if ((*(char *)n == '\0') || (*(char *)(n + 1) != ':')) {
      if (*(char *)n == '~') {
        local_28 = 1;
        while( true ) {
          bVar3 = false;
          if (*(char *)(n + local_28) != '\0') {
            bVar3 = *(char *)(n + local_28) != '/';
          }
          if (!bVar3) break;
          local_28 = local_28 + 1;
        }
        if (root != (string *)0x0) {
          std::__cxx11::string::assign((char *)root,n);
          std::__cxx11::string::operator+=((string *)root,'/');
        }
        if (*(char *)(n + local_28) == '/') {
          local_28 = local_28 + 1;
        }
        n = n + local_28;
      }
      else if (root != (string *)0x0) {
        std::__cxx11::string::operator=((string *)root,"");
      }
    }
    else {
      if (root != (string *)0x0) {
        std::__cxx11::string::operator=((string *)root,"_:");
        cVar1 = *(char *)n;
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)root);
        *pcVar2 = cVar1;
      }
      n = n + 2;
    }
  }
  else {
    if (root != (string *)0x0) {
      std::__cxx11::string::operator=((string *)root,"_:/");
      cVar1 = *(char *)n;
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)root);
      *pcVar2 = cVar1;
    }
    n = n + 3;
  }
  return (char *)n;
}

Assistant:

const char* SystemTools::SplitPathRootComponent(const std::string& p,
                                                std::string* root)
{
  // Identify the root component.
  const char* c = p.c_str();
  if ((c[0] == '/' && c[1] == '/') || (c[0] == '\\' && c[1] == '\\')) {
    // Network path.
    if (root) {
      *root = "//";
    }
    c += 2;
  } else if (c[0] == '/' || c[0] == '\\') {
    // Unix path (or Windows path w/out drive letter).
    if (root) {
      *root = "/";
    }
    c += 1;
  } else if (c[0] && c[1] == ':' && (c[2] == '/' || c[2] == '\\')) {
    // Windows path.
    if (root) {
      (*root) = "_:/";
      (*root)[0] = c[0];
    }
    c += 3;
  } else if (c[0] && c[1] == ':') {
    // Path relative to a windows drive working directory.
    if (root) {
      (*root) = "_:";
      (*root)[0] = c[0];
    }
    c += 2;
  } else if (c[0] == '~') {
    // Home directory.  The returned root should always have a
    // trailing slash so that appending components as
    // c[0]c[1]/c[2]/... works.  The remaining path returned should
    // skip the first slash if it exists:
    //
    //   "~"    : root = "~/" , return ""
    //   "~/    : root = "~/" , return ""
    //   "~/x   : root = "~/" , return "x"
    //   "~u"   : root = "~u/", return ""
    //   "~u/"  : root = "~u/", return ""
    //   "~u/x" : root = "~u/", return "x"
    size_t n = 1;
    while (c[n] && c[n] != '/') {
      ++n;
    }
    if (root) {
      root->assign(c, n);
      *root += '/';
    }
    if (c[n] == '/') {
      ++n;
    }
    c += n;
  } else {
    // Relative path.
    if (root) {
      *root = "";
    }
  }

  // Return the remaining path.
  return c;
}